

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::PipelineClassifier::MergeFrom
          (PipelineClassifier *this,PipelineClassifier *from)

{
  void *pvVar1;
  LogMessage *other;
  Pipeline *this_00;
  Pipeline *from_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/Model.pb.cc"
               ,0x2b2);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  from_00 = from->pipeline_;
  if (from_00 != (Pipeline *)0x0 &&
      from != (PipelineClassifier *)&_PipelineClassifier_default_instance_) {
    this_00 = this->pipeline_;
    if (this_00 == (Pipeline *)0x0) {
      this_00 = (Pipeline *)operator_new(0x48);
      Pipeline::Pipeline(this_00);
      this->pipeline_ = this_00;
      from_00 = from->pipeline_;
    }
    if (from_00 == (Pipeline *)0x0) {
      from_00 = (Pipeline *)&_Pipeline_default_instance_;
    }
    Pipeline::MergeFrom(this_00,from_00);
  }
  return;
}

Assistant:

void PipelineClassifier::MergeFrom(const PipelineClassifier& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.PipelineClassifier)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_pipeline()) {
    mutable_pipeline()->::CoreML::Specification::Pipeline::MergeFrom(from.pipeline());
  }
}